

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::clearBufferiv
          (ReferenceContext *this,deUint32 buffer,int drawbuffer,int *value)

{
  int iVar1;
  deUint32 stencil_00;
  bool bVar2;
  deBool dVar3;
  int iVar4;
  int iVar5;
  bool *pbVar6;
  int *piVar7;
  ConstPixelBufferAccess *pCVar8;
  PixelBufferAccess *this_00;
  PixelBufferAccess *pPVar9;
  InternalError *this_01;
  byte local_1fa;
  byte local_1f9;
  int local_1f0;
  int local_1ec;
  int s_1;
  int x_1;
  int y_1;
  int stencil;
  undefined1 local_1b8 [8];
  MultisamplePixelBufferAccess access_1;
  IVec4 local_168;
  undefined1 local_158 [8];
  IVec4 area_1;
  MultisamplePixelBufferAccess stencilBuf;
  undefined1 local_10c [16];
  IVec4 local_fc;
  int local_ec;
  int local_e8;
  int s;
  int x;
  int y;
  IVec4 color;
  MultisamplePixelBufferAccess access;
  IVec4 local_7c;
  undefined1 local_6c [8];
  IVec4 area;
  bool maskZero;
  bool maskUsed;
  MultisamplePixelBufferAccess colorBuf;
  IVec4 baseArea;
  int *value_local;
  int drawbuffer_local;
  deUint32 buffer_local;
  ReferenceContext *this_local;
  
  do {
    if ((buffer != 0x1800) && (buffer != 0x1802)) {
      setError(this,0x500);
      return;
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    if (drawbuffer != 0) {
      setError(this,0x501);
      return;
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  if ((this->m_scissorEnabled & 1U) == 0) {
    tcu::Vector<int,_4>::Vector
              ((Vector<int,_4> *)&colorBuf.m_access.super_ConstPixelBufferAccess.m_data,0,0,
               0x7fffffff,0x7fffffff);
  }
  else {
    tcu::Vector<int,_4>::Vector
              ((Vector<int,_4> *)&colorBuf.m_access.super_ConstPixelBufferAccess.m_data,
               &this->m_scissorBox);
  }
  if (buffer == 0x1800) {
    getDrawColorbuffer((MultisamplePixelBufferAccess *)(area.m_data + 3),this);
    pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,0);
    local_1f9 = 1;
    if ((*pbVar6 & 1U) != 0) {
      pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,1);
      local_1f9 = 1;
      if ((*pbVar6 & 1U) != 0) {
        pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,2);
        local_1f9 = 1;
        if ((*pbVar6 & 1U) != 0) {
          pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,3);
          local_1f9 = *pbVar6 ^ 0xff;
        }
      }
    }
    area.m_data[2]._3_1_ = local_1f9 & 1;
    pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,0);
    local_1fa = 0;
    if ((*pbVar6 & 1U) == 0) {
      pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,1);
      local_1fa = 0;
      if ((*pbVar6 & 1U) == 0) {
        pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,2);
        local_1fa = 0;
        if ((*pbVar6 & 1U) == 0) {
          pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,3);
          local_1fa = *pbVar6 ^ 0xff;
        }
      }
    }
    area.m_data[2]._2_1_ = local_1fa & 1;
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)
               &access.m_access.super_ConstPixelBufferAccess.m_data,
               (MultisamplePixelBufferAccess *)(area.m_data + 3));
    getBufferRect((sglr *)&local_7c,
                  (MultisampleConstPixelBufferAccess *)
                  &access.m_access.super_ConstPixelBufferAccess.m_data);
    intersect((sglr *)local_6c,(IVec4 *)&colorBuf.m_access.super_ConstPixelBufferAccess.m_data,
              &local_7c);
    bVar2 = isEmpty((IVec4 *)local_6c);
    if ((!bVar2) && ((area.m_data[2]._2_1_ & 1) == 0)) {
      piVar7 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_6c);
      iVar5 = *piVar7;
      piVar7 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_6c);
      iVar4 = *piVar7;
      piVar7 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_6c);
      iVar1 = *piVar7;
      piVar7 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_6c);
      rr::getSubregion((MultisamplePixelBufferAccess *)(color.m_data + 2),
                       (MultisamplePixelBufferAccess *)(area.m_data + 3),iVar5,iVar4,iVar1,*piVar7);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&x,*value,value[1],value[2],value[3]);
      if ((area.m_data[2]._3_1_ & 1) == 0) {
        rr::clear((MultisamplePixelBufferAccess *)(color.m_data + 2),(IVec4 *)&x);
      }
      else {
        s = 0;
        while( true ) {
          iVar5 = s;
          pCVar8 = &rr::MultisamplePixelBufferAccess::raw
                              ((MultisamplePixelBufferAccess *)(color.m_data + 2))->
                    super_ConstPixelBufferAccess;
          iVar4 = tcu::ConstPixelBufferAccess::getDepth(pCVar8);
          if (iVar4 <= iVar5) break;
          local_e8 = 0;
          while( true ) {
            iVar5 = local_e8;
            pCVar8 = &rr::MultisamplePixelBufferAccess::raw
                                ((MultisamplePixelBufferAccess *)(color.m_data + 2))->
                      super_ConstPixelBufferAccess;
            iVar4 = tcu::ConstPixelBufferAccess::getHeight(pCVar8);
            if (iVar4 <= iVar5) break;
            for (local_ec = 0; iVar5 = local_ec,
                iVar4 = rr::MultisamplePixelBufferAccess::getNumSamples
                                  ((MultisamplePixelBufferAccess *)(color.m_data + 2)),
                iVar5 < iVar4; local_ec = local_ec + 1) {
              this_00 = rr::MultisamplePixelBufferAccess::raw
                                  ((MultisamplePixelBufferAccess *)(color.m_data + 2));
              pPVar9 = rr::MultisamplePixelBufferAccess::raw
                                 ((MultisamplePixelBufferAccess *)(color.m_data + 2));
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_10c,(int)pPVar9,local_ec,local_e8);
              tcu::select<int,4>((tcu *)&local_fc,(Vector<int,_4> *)&x,(Vector<int,_4> *)local_10c,
                                 &this->m_colorMask);
              tcu::PixelBufferAccess::setPixel(this_00,&local_fc,local_ec,local_e8,s);
            }
            local_e8 = local_e8 + 1;
          }
          s = s + 1;
        }
      }
    }
  }
  else {
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (buffer != 0x1802)) {
        this_01 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this_01,(char *)0x0,"buffer == GL_STENCIL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                   ,0xd78);
        __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    getDrawStencilbuffer((MultisamplePixelBufferAccess *)(area_1.m_data + 2),this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)
               &access_1.m_access.super_ConstPixelBufferAccess.m_data,
               (MultisamplePixelBufferAccess *)(area_1.m_data + 2));
    getBufferRect((sglr *)&local_168,
                  (MultisampleConstPixelBufferAccess *)
                  &access_1.m_access.super_ConstPixelBufferAccess.m_data);
    intersect((sglr *)local_158,(IVec4 *)&colorBuf.m_access.super_ConstPixelBufferAccess.m_data,
              &local_168);
    bVar2 = isEmpty((IVec4 *)local_158);
    if ((!bVar2) && (this->m_stencil[0].writeMask != 0)) {
      piVar7 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_158);
      iVar5 = *piVar7;
      piVar7 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_158);
      iVar4 = *piVar7;
      piVar7 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_158);
      iVar1 = *piVar7;
      piVar7 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_158);
      rr::getSubregion((MultisamplePixelBufferAccess *)&y_1,
                       (MultisamplePixelBufferAccess *)(area_1.m_data + 2),iVar5,iVar4,iVar1,*piVar7
                      );
      getStencilMultisampleAccess
                ((MultisamplePixelBufferAccess *)local_1b8,(MultisamplePixelBufferAccess *)&y_1);
      stencil_00 = *value;
      s_1 = 0;
      while( true ) {
        pCVar8 = &rr::MultisamplePixelBufferAccess::raw((MultisamplePixelBufferAccess *)local_1b8)->
                  super_ConstPixelBufferAccess;
        iVar5 = tcu::ConstPixelBufferAccess::getDepth(pCVar8);
        if (iVar5 <= s_1) break;
        local_1ec = 0;
        while( true ) {
          pCVar8 = &rr::MultisamplePixelBufferAccess::raw((MultisamplePixelBufferAccess *)local_1b8)
                    ->super_ConstPixelBufferAccess;
          iVar5 = tcu::ConstPixelBufferAccess::getHeight(pCVar8);
          if (iVar5 <= local_1ec) break;
          for (local_1f0 = 0;
              iVar5 = rr::MultisamplePixelBufferAccess::getNumSamples
                                ((MultisamplePixelBufferAccess *)local_1b8), local_1f0 < iVar5;
              local_1f0 = local_1f0 + 1) {
            writeMaskedStencil((MultisamplePixelBufferAccess *)local_1b8,local_1f0,local_1ec,s_1,
                               stencil_00,this->m_stencil[0].writeMask);
          }
          local_1ec = local_1ec + 1;
        }
        s_1 = s_1 + 1;
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::clearBufferiv (deUint32 buffer, int drawbuffer, const int* value)
{
	RC_IF_ERROR(buffer != GL_COLOR && buffer != GL_STENCIL, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(drawbuffer != 0, GL_INVALID_VALUE, RC_RET_VOID); // \todo [2012-04-06 pyry] MRT support.

	IVec4 baseArea = m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);

	if (buffer == GL_COLOR)
	{
		rr::MultisamplePixelBufferAccess	colorBuf	= getDrawColorbuffer();
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];
		IVec4								area		= intersect(baseArea, getBufferRect(colorBuf));

		if (!isEmpty(area) && !maskZero)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf, area.x(), area.y(), area.z(), area.w());
			IVec4								color		(value[0], value[1], value[2], value[3]);

			if (!maskUsed)
				rr::clear(access, color);
			else
			{
				for (int y = 0; y < access.raw().getDepth(); y++)
					for (int x = 0; x < access.raw().getHeight(); x++)
						for (int s = 0; s < access.getNumSamples(); s++)
							access.raw().setPixel(tcu::select(color, access.raw().getPixelInt(s, x, y), m_colorMask), s, x, y);
			}
		}
	}
	else
	{
		TCU_CHECK_INTERNAL(buffer == GL_STENCIL);

		rr::MultisamplePixelBufferAccess	stencilBuf	= getDrawStencilbuffer();
		IVec4								area		= intersect(baseArea, getBufferRect(stencilBuf));

		if (!isEmpty(area) && m_stencil[rr::FACETYPE_FRONT].writeMask != 0)
		{
			rr::MultisamplePixelBufferAccess	access		= getStencilMultisampleAccess(rr::getSubregion(stencilBuf, area.x(), area.y(), area.z(), area.w()));
			int									stencil		= value[0];

			for (int y = 0; y < access.raw().getDepth(); y++)
				for (int x = 0; x < access.raw().getHeight(); x++)
					for (int s = 0; s < access.getNumSamples(); s++)
						writeMaskedStencil(access, s, x, y, stencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
		}
	}
}